

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O0

void set_cmninit(feat_t *fcb,char *cmninit)

{
  char *ptr;
  bool bVar1;
  double dVar2;
  int local_34;
  int32 nvals;
  char *vallist;
  char *cc;
  char *c;
  char *cmninit_local;
  feat_t *fcb_local;
  
  if ((cmninit != (char *)0x0) && (fcb->cmn_struct != (cmn_t *)0x0)) {
    ptr = __ckd_salloc__(cmninit,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                         ,0x1a4);
    local_34 = 0;
    cc = ptr;
    while( true ) {
      bVar1 = false;
      if (local_34 < fcb->cmn_struct->veclen) {
        vallist = strchr(cc,0x2c);
        bVar1 = vallist != (char *)0x0;
      }
      if (!bVar1) break;
      *vallist = '\0';
      dVar2 = atof(cc);
      fcb->cmn_struct->cmn_mean[local_34] = (mfcc_t)(float)dVar2;
      cc = vallist + 1;
      local_34 = local_34 + 1;
    }
    if ((local_34 < fcb->cmn_struct->veclen) && (*cc != '\0')) {
      dVar2 = atof(cc);
      fcb->cmn_struct->cmn_mean[local_34] = (mfcc_t)(float)dVar2;
    }
    ckd_free(ptr);
  }
  return;
}

Assistant:

void
set_cmninit(feat_t *fcb, char const *cmninit)
{
    char *c, *cc, *vallist;
    int32 nvals;

    if (cmninit == NULL)
        return;
    if (fcb->cmn_struct == NULL)
	return;
    vallist = ckd_salloc(cmninit);
    c = vallist;
    nvals = 0;
    while (nvals < fcb->cmn_struct->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
        c = cc + 1;
        ++nvals;
    }
    if (nvals < fcb->cmn_struct->veclen && *c != '\0') {
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
    }
    ckd_free(vallist);
}